

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

bool spvtools::val::anon_unknown_0::isMissingOffsetInStruct
               (uint32_t struct_id,ValidationState_t *vstate)

{
  pointer *this;
  bool bVar1;
  Op OVar2;
  Decoration DVar3;
  int iVar4;
  Instruction *this_00;
  size_type __new_size;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  const_reference pvVar5;
  reference puVar6;
  iterator iVar7;
  iterator iVar8;
  byte local_11a;
  iterator iStack_d0;
  uint id;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  undefined1 auStack_b0 [3];
  bool nestedStructsMissingOffset;
  undefined4 local_9c;
  Decoration *local_98;
  Decoration *decoration;
  iterator __end3;
  iterator __begin3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> struct_members;
  vector<bool,_std::allocator<bool>_> hasOffset;
  Instruction *inst;
  ValidationState_t *vstate_local;
  uint32_t struct_id_local;
  
  this_00 = ValidationState_t::FindDef(vstate,struct_id);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             &struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  OVar2 = Instruction::opcode(this_00);
  if (OVar2 == OpTypeStruct) {
    getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3,struct_id,
                     vstate);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&__range3);
    __new_size = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
    std::vector<bool,_std::allocator<bool>_>::resize
              ((vector<bool,_std::allocator<bool>_> *)
               &struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,__new_size,false);
    this_01 = ValidationState_t::id_decorations(vstate,struct_id);
    __end3 = std::
             set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
             ::begin(this_01);
    decoration = (Decoration *)
                 std::
                 set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
                 ::end(this_01);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&decoration), bVar1) {
      local_98 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3);
      DVar3 = Decoration::dec_type(local_98);
      if ((DVar3 == DecorationOffset) &&
         (iVar4 = Decoration::struct_member_index(local_98), iVar4 != -1)) {
        this_02 = Decoration::params(local_98);
        pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_02,0);
        if (*pvVar5 == 0xffffffff) {
          vstate_local._7_1_ = true;
          goto LAB_002d0ce3;
        }
        iVar4 = Decoration::struct_member_index(local_98);
        _auStack_b0 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)
                                 &struct_members.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar4);
        std::_Bit_reference::operator=((_Bit_reference *)auStack_b0,true);
      }
      std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3);
    }
  }
  else {
    OVar2 = Instruction::opcode(this_00);
    if ((OVar2 == OpTypeArray) ||
       (OVar2 = Instruction::opcode(this_00), OVar2 == OpTypeRuntimeArray)) {
      std::vector<bool,_std::allocator<bool>_>::resize
                ((vector<bool,_std::allocator<bool>_> *)
                 &struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,1,true);
      __range2._4_4_ = Instruction::GetOperandAs<unsigned_int>(this_00,1);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,
                 (value_type_conflict2 *)((long)&__range2 + 4));
    }
  }
  __range2._3_1_ = 0;
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  iStack_d0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff30);
    if (!bVar1) {
LAB_002d0c28:
      local_11a = 1;
      if ((__range2._3_1_ & 1) == 0) {
        this = &struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
        iVar7 = std::vector<bool,_std::allocator<bool>_>::begin
                          ((vector<bool,_std::allocator<bool>_> *)this);
        iVar8 = std::vector<bool,_std::allocator<bool>_>::end
                          ((vector<bool,_std::allocator<bool>_> *)this);
        bVar1 = std::
                all_of<std::_Bit_iterator,spvtools::val::(anonymous_namespace)::isMissingOffsetInStruct(unsigned_int,spvtools::val::ValidationState_t&)::__0>
                          (iVar7.super__Bit_iterator_base._M_p,
                           iVar7.super__Bit_iterator_base._M_offset,
                           iVar8.super__Bit_iterator_base._M_p,
                           iVar8.super__Bit_iterator_base._M_offset);
        local_11a = bVar1 ^ 0xff;
      }
      vstate_local._7_1_ = (bool)(local_11a & 1);
LAB_002d0ce3:
      local_9c = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)
                 &struct_members.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      return vstate_local._7_1_;
    }
    puVar6 = __gnu_cxx::
             __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    bVar1 = isMissingOffsetInStruct(*puVar6,vstate);
    if (bVar1) {
      __range2._3_1_ = 1;
      goto LAB_002d0c28;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator++(&__end2);
  } while( true );
}

Assistant:

bool isMissingOffsetInStruct(uint32_t struct_id, ValidationState_t& vstate) {
  const auto* inst = vstate.FindDef(struct_id);
  std::vector<bool> hasOffset;
  std::vector<uint32_t> struct_members;
  if (inst->opcode() == spv::Op::OpTypeStruct) {
    // Check offsets of member decorations.
    struct_members = getStructMembers(struct_id, vstate);
    hasOffset.resize(struct_members.size(), false);

    for (auto& decoration : vstate.id_decorations(struct_id)) {
      if (spv::Decoration::Offset == decoration.dec_type() &&
          Decoration::kInvalidMember != decoration.struct_member_index()) {
        // Offset 0xffffffff is not valid so ignore it for simplicity's sake.
        if (decoration.params()[0] == 0xffffffff) return true;
        hasOffset[decoration.struct_member_index()] = true;
      }
    }
  } else if (inst->opcode() == spv::Op::OpTypeArray ||
             inst->opcode() == spv::Op::OpTypeRuntimeArray) {
    hasOffset.resize(1, true);
    struct_members.push_back(inst->GetOperandAs<uint32_t>(1u));
  }
  // Look through nested structs (which may be in an array).
  bool nestedStructsMissingOffset = false;
  for (auto id : struct_members) {
    if (isMissingOffsetInStruct(id, vstate)) {
      nestedStructsMissingOffset = true;
      break;
    }
  }
  return nestedStructsMissingOffset ||
         !std::all_of(hasOffset.begin(), hasOffset.end(),
                      [](const bool b) { return b; });
}